

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O1

void __thiscall
CServerBrowser::SetFavoritePassword(CServerBrowser *this,char *pAddress,char *pPassword)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  CServerEntry *pCVar4;
  int i;
  uint ServerlistType;
  long in_FS_OFFSET;
  NETADDR Addr;
  NETADDR local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CServerBrowserFavorites::AddFavoriteEx
                    (&this->m_ServerBrowserFavorites,pAddress,(NETADDR *)0x0,false,pPassword);
  if (bVar2) {
    local_48.type = 0;
    local_48.ip[0] = '\0';
    local_48.ip[1] = '\0';
    local_48.ip[2] = '\0';
    local_48.ip[3] = '\0';
    local_48.ip[4] = '\0';
    local_48.ip[5] = '\0';
    local_48.ip[6] = '\0';
    local_48.ip[7] = '\0';
    local_48.ip[8] = '\0';
    local_48.ip[9] = '\0';
    local_48.ip[10] = '\0';
    local_48.ip[0xb] = '\0';
    local_48.ip[0xc] = '\0';
    local_48.ip[0xd] = '\0';
    local_48.ip[0xe] = '\0';
    local_48.ip[0xf] = '\0';
    local_48.port = 0;
    local_48.reserved = 0;
    iVar3 = net_addr_from_str(&local_48,pAddress);
    if (iVar3 == 0) {
      ServerlistType = 0;
      do {
        pCVar4 = Find(this,ServerlistType,&local_48);
        if (pCVar4 != (CServerEntry *)0x0) {
          (pCVar4->m_Info).m_Favorite = true;
          uVar1 = this->m_ActServerlistType;
          if (ServerlistType == uVar1) {
            CServerBrowserFilter::Sort
                      (&this->m_ServerBrowserFilter,this->m_aServerlist[uVar1].m_ppServerlist,
                       this->m_aServerlist[uVar1].m_NumServers,2);
          }
        }
        ServerlistType = ServerlistType + 1;
      } while (ServerlistType == 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::SetFavoritePassword(const char *pAddress, const char *pPassword)
{
	if(m_ServerBrowserFavorites.AddFavoriteEx(pAddress, 0, false, pPassword))
	{
		NETADDR Addr = {0};
		if(net_addr_from_str(&Addr, pAddress))
			return;
		for(int i = 0; i < NUM_TYPES; ++i)
		{
			CServerEntry *pEntry = Find(i, Addr);
			if(pEntry)
			{
				pEntry->m_Info.m_Favorite = true;

				// refresh servers in all filters where favorites are filtered
				if(i == m_ActServerlistType)
					m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FAV);
			}
		}
	}
}